

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.hpp
# Opt level: O2

bool duckdb::VectorCastHelpers::TryCastLoop<unsigned_short,unsigned_int,duckdb::NumericTryCast>
               (Vector *source,Vector *result,idx_t count,CastParameters *parameters)

{
  bool bVar1;
  
  bVar1 = TemplatedTryCastLoop<unsigned_short,unsigned_int,duckdb::VectorTryCastOperator<duckdb::NumericTryCast>>
                    (source,result,count,parameters);
  return bVar1;
}

Assistant:

static bool TryCastLoop(Vector &source, Vector &result, idx_t count, CastParameters &parameters) {
		return TemplatedTryCastLoop<SRC, DST, VectorTryCastOperator<OP>>(source, result, count, parameters);
	}